

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O1

void __kmp_dispatch_init_algorithm<int>
               (ident_t *loc,int gtid,dispatch_private_info_template<int> *pr,sched_type schedule,
               int lb,int ub,signed_t st,kmp_uint64 *cur_chunk,signed_t chunk,int nproc,int tid)

{
  kmp_info_t *pkVar1;
  kmp_team_p *pkVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  UT UVar11;
  int iVar12;
  sched_type sVar13;
  sched_type sVar14;
  sched_type *psVar15;
  ulong uVar16;
  UT UVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  sched_type sVar22;
  uint uVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  int local_90;
  kmp_msg_t local_78;
  kmp_msg_t local_60;
  kmp_msg_t local_48;
  
  pkVar1 = __kmp_threads[gtid];
  pkVar2 = (pkVar1->th).th_team;
  iVar12 = (pkVar2->t).t_serialized;
  bVar26 = false;
  if ((__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0) &&
     (bVar26 = false, __kmp_forkjoin_frames_mode == 3)) {
    if ((*(int *)(pkVar1->th_pad + 0x20) == 0) &&
       ((pkVar1->th).th_teams_microtask == (microtask_t)0x0)) {
      bVar26 = (pkVar2->t).t_active_level == 1;
    }
    else {
      bVar26 = false;
    }
  }
  sVar13 = schedule & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
  if (sVar13 - kmp_nm_lower < 0x28) {
    pr->flags = (kmp_sched_flags_t)((uint)pr->flags | 2);
    sVar13 = sVar13 - 0x80;
  }
  else {
    pr->flags = (kmp_sched_flags_t)((uint)pr->flags & 0xfffffffd);
  }
  pr->type_size = 4;
  if ((sVar13 & kmp_ord_lower) == 0) {
    pr->flags = (kmp_sched_flags_t)((uint)pr->flags & 0xfffffffe);
  }
  else {
    pr->flags = (kmp_sched_flags_t)((uint)pr->flags | 1);
    sVar13 = sVar13 - kmp_sch_lower;
  }
  bVar24 = ((uint)pr->flags & 1) != 0 || (schedule >> 0x1e & 1) == 0;
  if (sVar13 == kmp_sch_runtime) {
    sVar14 = (pkVar2->t).t_sched.field_0.r_sched_type;
    bVar24 = (sVar14 >> 0x1e & 1) == 0;
    sVar14 = sVar14 & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
    if (sVar14 == kmp_sch_default) {
      psVar15 = &__kmp_static;
LAB_0015b1e6:
      sVar14 = *psVar15;
    }
    else if (sVar14 == kmp_sch_guided_chunked) {
      psVar15 = &__kmp_guided;
      goto LAB_0015b1e6;
    }
    chunk = (pkVar2->t).t_sched.field_0.chunk;
    if (cur_chunk != (kmp_uint64 *)0x0) {
      *cur_chunk = (long)chunk;
    }
LAB_0015b203:
    if (sVar14 == kmp_sch_auto) {
      sVar14 = __kmp_auto;
    }
    sVar22 = kmp_sch_static_steal;
    if (bVar24 || sVar14 != kmp_sch_dynamic_chunked) {
      sVar22 = sVar14;
    }
    if ((0x100000 < nproc) && (sVar22 == kmp_sch_guided_analytical_chunked)) {
      __kmp_msg_format(&local_48,0x40059);
      __kmp_msg(kmp_ms_warning);
      sVar22 = kmp_sch_guided_iterative_chunked;
    }
    if (sVar22 == kmp_sch_runtime_simd) {
      sVar13 = (pkVar2->t).t_sched.field_0.r_sched_type;
      sVar22 = kmp_sch_static_balanced_chunked;
      if (((sVar13 & 0x9ffffffb) != kmp_sch_default) &&
         (sVar13 = sVar13 & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic),
         sVar13 != __kmp_static)) {
        sVar22 = sVar13;
        if (sVar13 == __kmp_guided) {
          sVar22 = kmp_sch_guided_simd;
        }
        if (sVar13 == kmp_sch_guided_chunked) {
          sVar22 = kmp_sch_guided_simd;
        }
        chunk = chunk * (pkVar2->t).t_sched.field_0.chunk;
      }
      if (cur_chunk != (kmp_uint64 *)0x0) {
        *cur_chunk = (long)chunk;
      }
    }
    (pr->u).p.field_6.parm1 = chunk;
  }
  else {
    sVar14 = __kmp_guided;
    if ((sVar13 == kmp_sch_guided_chunked) ||
       (sVar22 = __kmp_static, sVar14 = sVar13, sVar13 != kmp_sch_default)) {
      if (chunk < 2) {
        chunk = 1;
      }
      goto LAB_0015b203;
    }
  }
  uVar9 = sVar22 - kmp_sch_static_chunked;
  if (0xe < uVar9) {
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/flang-compiler[P]openmp/runtime/src/kmp_dispatch.cpp"
                       ,0x11d);
  }
  (pr->u).p.count = 0;
  if ((st == 0) && (__kmp_env_consistency_check != 0)) {
    __kmp_error_construct
              (kmp_i18n_msg_CnsLoopIncrZeroProhibited,(uint)pr->flags & ct_parallel | ct_pdo,loc);
  }
  if (st == 1) {
    if (ub < lb) {
      uVar23 = 0;
    }
    else {
      uVar23 = (ub - lb) + 1;
    }
  }
  else {
    if (st < 0) {
      if (lb < ub) goto LAB_0015b3c7;
      uVar23 = (uint)(lb - ub) / (uint)-st;
    }
    else {
      if (ub < lb) {
LAB_0015b3c7:
        uVar23 = 0;
        goto LAB_0015b3e5;
      }
      uVar23 = (uint)(ub - lb) / (uint)st;
    }
    uVar23 = uVar23 + 1;
  }
LAB_0015b3e5:
  (pr->u).p.lb = lb;
  (pr->u).p.ub = ub;
  (pr->u).p.st = st;
  (pr->u).p.tc = uVar23;
  if ((iVar12 == 0) && (((uint)pr->flags & 1) != 0)) {
    pr->ordered_bumped = 0;
    (pr->u).p64.field_6.parm1 = 1;
  }
  if (0xd < uVar9) {
switchD_0015b432_caseD_1:
    __kmp_msg_format(&local_60,0x40058);
    __kmp_msg_format(&local_78,0x50016);
    __kmp_fatal();
  }
  UVar17 = (&switchD_0015b432::switchdataD_00180668)[uVar9] + 0x180668;
  sVar13 = sVar22;
  switch(uVar9) {
  case 0:
  case 2:
    if ((pr->u).p.field_6.parm1 < 1) {
      (pr->u).p.field_6.parm1 = 1;
    }
    goto LAB_0015b725;
  default:
    goto switchD_0015b432_caseD_1;
  case 6:
    iVar12 = (int)uVar23 / (nproc * 2);
    if (iVar12 < 2) {
      iVar12 = 1;
    }
    iVar20 = iVar12;
    if (chunk < iVar12) {
      iVar20 = chunk;
    }
    if (chunk < 1) {
      iVar20 = 1;
    }
    iVar8 = (int)(iVar20 + iVar12 + uVar23 * 2 + -1) / (iVar20 + iVar12);
    iVar21 = 2;
    if (2 < iVar8) {
      iVar21 = iVar8;
    }
    (pr->u).p.field_6.parm1 = iVar20;
    (pr->u).p.field_6.parm2 = iVar12;
    (pr->u).p.field_6.parm3 = iVar21;
    (pr->u).p.field_6.parm4 = (iVar12 - iVar20) / (iVar21 + -1);
    sVar13 = kmp_sch_trapezoidal;
    goto LAB_0015b725;
  case 7:
    if (1 < nproc) {
      uVar23 = (int)(nproc + uVar23 + -1) / nproc;
    }
    break;
  case 8:
    goto LAB_0015b5d4;
  case 9:
  case 0xd:
    if (1 < nproc) {
      sVar13 = kmp_sch_dynamic_chunked;
      if ((long)((ulong)(uint)nproc * ((long)chunk * 2 + 1)) < (long)(int)uVar23) {
        (pr->u).p.field_6.parm2 = (chunk + 1) * nproc * 2;
        *(double *)((long)&pr->u + 0x28) = 0.5 / (double)nproc;
        sVar13 = sVar22;
      }
      goto LAB_0015b725;
    }
    break;
  case 10:
    if (1 < nproc) {
      sVar13 = kmp_sch_dynamic_chunked;
      if ((long)(int)uVar23 <= (long)((ulong)(uint)nproc * ((long)chunk * 2 + 1)))
      goto LAB_0015b725;
      dVar4 = 1.0;
      dVar3 = -0.5 / (double)nproc + 1.0;
      *(double *)((long)&pr->u + 0x28) = dVar3;
      uVar9 = 0xe5;
      dVar5 = dVar3;
      do {
        dVar6 = dVar4 * dVar5;
        if ((uVar9 & 1) == 0) {
          dVar6 = dVar4;
        }
        dVar4 = dVar6;
        dVar5 = dVar5 * dVar5;
        bVar26 = 1 < uVar9;
        uVar9 = uVar9 >> 1;
      } while (bVar26);
      dVar5 = (((double)chunk + (double)chunk + 1.0) * (double)nproc) / (double)(int)uVar23;
      if (dVar4 <= dVar5) {
        uVar19 = 0xe5;
        uVar9 = 0;
      }
      else {
        uVar19 = 0xe5;
        do {
          uVar9 = uVar19;
          dVar4 = dVar4 * dVar4;
          uVar19 = uVar9 * 2;
          if (dVar4 <= dVar5) break;
        } while (uVar19 < 0x8000000);
        uVar9 = uVar9 & 0x7fffffff;
      }
      while (uVar10 = uVar9, uVar10 + 1 < uVar19) {
        uVar9 = uVar19 + uVar10 >> 1;
        dVar4 = 1.0;
        if (1 < uVar19 + uVar10) {
          uVar16 = (ulong)uVar9;
          dVar6 = dVar3;
          dVar7 = 1.0;
          do {
            dVar4 = dVar7 * dVar6;
            if ((uVar16 & 1) == 0) {
              dVar4 = dVar7;
            }
            dVar6 = dVar6 * dVar6;
            uVar18 = (uint)uVar16;
            uVar16 = uVar16 >> 1;
            dVar7 = dVar4;
          } while (1 < uVar18);
        }
        if (dVar4 <= dVar5) {
          uVar19 = uVar9;
          uVar9 = uVar10;
        }
      }
      if (uVar19 == 0) {
LAB_0015b910:
        __kmp_debug_assert("assertion failure",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/flang-compiler[P]openmp/runtime/src/kmp_dispatch.cpp"
                           ,0x25c);
      }
      else {
        dVar4 = 1.0;
        if (uVar19 - 1 != 0) {
          uVar9 = uVar19 - 1;
          dVar6 = dVar3;
          dVar7 = 1.0;
          do {
            dVar4 = dVar7 * dVar6;
            if ((uVar9 & 1) == 0) {
              dVar4 = dVar7;
            }
            dVar6 = dVar6 * dVar6;
            bVar26 = 1 < uVar9;
            uVar9 = uVar9 >> 1;
            dVar7 = dVar4;
          } while (bVar26);
        }
        if (dVar4 <= dVar5) goto LAB_0015b910;
        uVar16 = (ulong)uVar19;
        dVar4 = dVar3;
        dVar6 = 1.0;
        do {
          dVar7 = dVar6 * dVar4;
          if ((uVar16 & 1) == 0) {
            dVar7 = dVar6;
          }
          dVar4 = dVar4 * dVar4;
          uVar9 = (uint)uVar16;
          uVar16 = uVar16 >> 1;
          dVar6 = dVar7;
        } while (1 < uVar9);
        if (dVar5 < dVar7) goto LAB_0015b910;
      }
      (pr->u).p.field_6.parm2 = uVar19;
      dVar4 = 1.0;
      if (uVar19 != 0) {
        uVar16 = (ulong)uVar19;
        dVar5 = 1.0;
        do {
          dVar4 = dVar5 * dVar3;
          if ((uVar16 & 1) == 0) {
            dVar4 = dVar5;
          }
          dVar3 = dVar3 * dVar3;
          uVar9 = (uint)uVar16;
          uVar16 = uVar16 >> 1;
          dVar5 = dVar4;
        } while (1 < uVar9);
      }
      dVar4 = (double)(int)uVar23 * dVar4;
      uVar16 = (ulong)ROUND(dVar4);
      local_90 = (int)uVar16;
      (pr->u).p.count =
           (uVar23 - (uVar19 * chunk + local_90)) - (uint)(dVar4 != (double)(uVar16 & 0xffffffff));
      sVar13 = kmp_sch_guided_analytical_chunked;
      goto LAB_0015b725;
    }
    break;
  case 0xb:
    uVar9 = ((int)uVar23 / chunk + 1) - (uint)((int)((long)(int)uVar23 % (long)chunk) == 0);
    bVar24 = nproc < 2;
    UVar17 = (UT)CONCAT71((int7)((ulong)((long)(int)uVar23 % (long)chunk) >> 8),bVar24);
    sVar22 = kmp_sch_static_balanced;
    if (nproc <= (int)uVar9 && !bVar24) {
      uVar10 = uVar9 / (uint)nproc;
      uVar18 = uVar9 % (uint)nproc;
      uVar19 = tid;
      if ((int)uVar18 < tid) {
        uVar19 = uVar18;
      }
      UVar17 = uVar19 + uVar10 * tid;
      (pr->u).p.count = UVar17;
      (pr->u).p.ub = (tid < (int)uVar18) + uVar10 + UVar17;
      (pr->u).p.field_6.parm2 = lb;
      iVar12 = uVar18 + uVar10;
      if (nproc <= (int)(uVar18 + uVar10)) {
        iVar12 = nproc;
      }
      (pr->u).p.field_6.parm3 = iVar12;
      UVar17 = (tid + 1) % nproc;
      (pr->u).p.field_6.parm4 = UVar17;
      (pr->u).p.st = st;
      sVar22 = kmp_sch_static_steal;
    }
    sVar13 = sVar22;
    if (nproc <= (int)uVar9 && !bVar24) goto LAB_0015b725;
LAB_0015b5d4:
    sVar13 = sVar22;
    if (nproc < 2) {
      if ((int)uVar23 < 1) {
        (pr->u).p.count = 1;
        (pr->u).p.field_6.parm1 = 0;
        goto LAB_0015b725;
      }
      UVar11 = uVar23 - 1;
      (pr->u).p.field_6.parm1 = 1;
      UVar17 = 0;
    }
    else {
      if ((int)uVar23 < nproc) {
        UVar11 = tid;
        if (tid < (int)uVar23) {
          bVar25 = uVar23 - 1 == tid;
          bVar24 = true;
          UVar17 = tid;
        }
        else {
          (pr->u).p.count = 1;
          bVar25 = false;
          bVar24 = false;
        }
      }
      else {
        uVar19 = uVar23 % (uint)nproc;
        uVar9 = uVar19;
        if (tid <= (int)uVar19) {
          uVar9 = tid;
        }
        UVar17 = uVar9 + (uVar23 / (uint)nproc) * tid;
        UVar11 = (uVar23 / (uint)nproc + UVar17) - (uint)((int)uVar19 <= tid);
        bVar25 = nproc + -1 == tid;
        bVar24 = true;
      }
      *(uint *)((long)&pr->u + 0x20) = (uint)bVar25;
      if (!bVar24) goto LAB_0015b725;
    }
    if (bVar26 && cur_chunk != (kmp_uint64 *)0x0) {
      *cur_chunk = (long)(int)((UVar11 - UVar17) + 1);
    }
    if (st == 1) {
      (pr->u).p.lb = UVar17 + lb;
      iVar12 = lb + UVar11;
    }
    else {
      iVar12 = UVar11 * st + lb;
      (pr->u).p.lb = UVar17 * st + lb;
      if (st < 1) {
        if (iVar12 + st < ub) {
          iVar12 = ub;
        }
      }
      else if (ub < iVar12 + st) {
        iVar12 = ub;
      }
    }
    (pr->u).p.ub = iVar12;
    if (((uint)pr->flags & 1) != 0) {
      (pr->u).p.ordered_lower = UVar17;
      (pr->u).p.ordered_upper = UVar11;
    }
    goto LAB_0015b725;
  case 0xc:
    if (nproc < 2) break;
    (pr->u).p.field_6.parm1 = -chunk & ((int)(nproc + uVar23 + -1) / nproc + chunk) - 1U;
    goto LAB_0015b720;
  }
  (pr->u).p.field_6.parm1 = uVar23;
LAB_0015b720:
  sVar13 = kmp_sch_static_greedy;
LAB_0015b725:
  pr->schedule = sVar13;
  return;
}

Assistant:

void __kmp_dispatch_init_algorithm(ident_t *loc, int gtid,
                                   dispatch_private_info_template<T> *pr,
                                   enum sched_type schedule, T lb, T ub,
                                   typename traits_t<T>::signed_t st,
#if USE_ITT_BUILD
                                   kmp_uint64 *cur_chunk,
#endif
                                   typename traits_t<T>::signed_t chunk,
                                   T nproc, T tid) {
  typedef typename traits_t<T>::unsigned_t UT;
  typedef typename traits_t<T>::floating_t DBL;

  int active;
  T tc;
  kmp_info_t *th;
  kmp_team_t *team;
  int monotonicity;
  bool use_hier;

#ifdef KMP_DEBUG
  typedef typename traits_t<T>::signed_t ST;
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format("__kmp_dispatch_init_algorithm: T#%%d called "
                            "pr:%%p lb:%%%s ub:%%%s st:%%%s "
                            "schedule:%%d chunk:%%%s nproc:%%%s tid:%%%s\n",
                            traits_t<T>::spec, traits_t<T>::spec,
                            traits_t<ST>::spec, traits_t<ST>::spec,
                            traits_t<T>::spec, traits_t<T>::spec);
    KD_TRACE(10, (buff, gtid, pr, lb, ub, st, schedule, chunk, nproc, tid));
    __kmp_str_free(&buff);
  }
#endif
  /* setup data */
  th = __kmp_threads[gtid];
  team = th->th.th_team;
  active = !team->t.t_serialized;

#if USE_ITT_BUILD
  int itt_need_metadata_reporting = __itt_metadata_add_ptr &&
                                    __kmp_forkjoin_frames_mode == 3 &&
                                    KMP_MASTER_GTID(gtid) &&
#if OMP_40_ENABLED
                                    th->th.th_teams_microtask == NULL &&
#endif
                                    team->t.t_active_level == 1;
#endif

#if KMP_USE_HIER_SCHED
  use_hier = pr->flags.use_hier;
#else
  use_hier = false;
#endif

  /* Pick up the nonmonotonic/monotonic bits from the scheduling type */
  monotonicity = __kmp_get_monotonicity(schedule, use_hier);
  schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);

  /* Pick up the nomerge/ordered bits from the scheduling type */
  if ((schedule >= kmp_nm_lower) && (schedule < kmp_nm_upper)) {
    pr->flags.nomerge = TRUE;
    schedule =
        (enum sched_type)(((int)schedule) - (kmp_nm_lower - kmp_sch_lower));
  } else {
    pr->flags.nomerge = FALSE;
  }
  pr->type_size = traits_t<T>::type_size; // remember the size of variables
  if (kmp_ord_lower & schedule) {
    pr->flags.ordered = TRUE;
    schedule =
        (enum sched_type)(((int)schedule) - (kmp_ord_lower - kmp_sch_lower));
  } else {
    pr->flags.ordered = FALSE;
  }
  // Ordered overrides nonmonotonic
  if (pr->flags.ordered) {
    monotonicity = SCHEDULE_MONOTONIC;
  }

  if (schedule == kmp_sch_static) {
    schedule = __kmp_static;
  } else {
    if (schedule == kmp_sch_runtime) {
      // Use the scheduling specified by OMP_SCHEDULE (or __kmp_sch_default if
      // not specified)
      schedule = team->t.t_sched.r_sched_type;
      monotonicity = __kmp_get_monotonicity(schedule, use_hier);
      schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);
      // Detail the schedule if needed (global controls are differentiated
      // appropriately)
      if (schedule == kmp_sch_guided_chunked) {
        schedule = __kmp_guided;
      } else if (schedule == kmp_sch_static) {
        schedule = __kmp_static;
      }
      // Use the chunk size specified by OMP_SCHEDULE (or default if not
      // specified)
      chunk = team->t.t_sched.chunk;
#if USE_ITT_BUILD
      if (cur_chunk)
        *cur_chunk = chunk;
#endif
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format("__kmp_dispatch_init_algorithm: T#%%d new: "
                                "schedule:%%d chunk:%%%s\n",
                                traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    } else {
      if (schedule == kmp_sch_guided_chunked) {
        schedule = __kmp_guided;
      }
      if (chunk <= 0) {
        chunk = KMP_DEFAULT_CHUNK;
      }
    }

    if (schedule == kmp_sch_auto) {
      // mapping and differentiation: in the __kmp_do_serial_initialize()
      schedule = __kmp_auto;
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init_algorithm: kmp_sch_auto: T#%%d new: "
            "schedule:%%d chunk:%%%s\n",
            traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    }
#if KMP_STATIC_STEAL_ENABLED
    // map nonmonotonic:dynamic to static steal
    if (schedule == kmp_sch_dynamic_chunked) {
      if (monotonicity == SCHEDULE_NONMONOTONIC)
        schedule = kmp_sch_static_steal;
    }
#endif
    /* guided analytical not safe for too many threads */
    if (schedule == kmp_sch_guided_analytical_chunked && nproc > 1 << 20) {
      schedule = kmp_sch_guided_iterative_chunked;
      KMP_WARNING(DispatchManyThreads);
    }
#if OMP_45_ENABLED
    if (schedule == kmp_sch_runtime_simd) {
      // compiler provides simd_width in the chunk parameter
      schedule = team->t.t_sched.r_sched_type;
      monotonicity = __kmp_get_monotonicity(schedule, use_hier);
      schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);
      // Detail the schedule if needed (global controls are differentiated
      // appropriately)
      if (schedule == kmp_sch_static || schedule == kmp_sch_auto ||
          schedule == __kmp_static) {
        schedule = kmp_sch_static_balanced_chunked;
      } else {
        if (schedule == kmp_sch_guided_chunked || schedule == __kmp_guided) {
          schedule = kmp_sch_guided_simd;
        }
        chunk = team->t.t_sched.chunk * chunk;
      }
#if USE_ITT_BUILD
      if (cur_chunk)
        *cur_chunk = chunk;
#endif
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init_algorithm: T#%%d new: schedule:%%d"
            " chunk:%%%s\n",
            traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    }
#endif // OMP_45_ENABLED
    pr->u.p.parm1 = chunk;
  }
  KMP_ASSERT2((kmp_sch_lower < schedule && schedule < kmp_sch_upper),
              "unknown scheduling type");

  pr->u.p.count = 0;

  if (__kmp_env_consistency_check) {
    if (st == 0) {
      __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrZeroProhibited,
                            (pr->flags.ordered ? ct_pdo_ordered : ct_pdo), loc);
    }
  }
  // compute trip count
  if (st == 1) { // most common case
    if (ub >= lb) {
      tc = ub - lb + 1;
    } else { // ub < lb
      tc = 0; // zero-trip
    }
  } else if (st < 0) {
    if (lb >= ub) {
      // AC: cast to unsigned is needed for loops like (i=2B; i>-2B; i-=1B),
      // where the division needs to be unsigned regardless of the result type
      tc = (UT)(lb - ub) / (-st) + 1;
    } else { // lb < ub
      tc = 0; // zero-trip
    }
  } else { // st > 0
    if (ub >= lb) {
      // AC: cast to unsigned is needed for loops like (i=-2B; i<2B; i+=1B),
      // where the division needs to be unsigned regardless of the result type
      tc = (UT)(ub - lb) / st + 1;
    } else { // ub < lb
      tc = 0; // zero-trip
    }
  }

#if KMP_STATS_ENABLED
  if (KMP_MASTER_GTID(gtid)) {
    KMP_COUNT_VALUE(OMP_loop_dynamic_total_iterations, tc);
  }
#endif

  pr->u.p.lb = lb;
  pr->u.p.ub = ub;
  pr->u.p.st = st;
  pr->u.p.tc = tc;

#if KMP_OS_WINDOWS
  pr->u.p.last_upper = ub + st;
#endif /* KMP_OS_WINDOWS */

  /* NOTE: only the active parallel region(s) has active ordered sections */

  if (active) {
    if (pr->flags.ordered) {
      pr->ordered_bumped = 0;
      pr->u.p.ordered_lower = 1;
      pr->u.p.ordered_upper = 0;
    }
  }

  switch (schedule) {
#if (KMP_STATIC_STEAL_ENABLED)
  case kmp_sch_static_steal: {
    T ntc, init;

    KD_TRACE(100,
             ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_steal case\n",
              gtid));

    ntc = (tc % chunk ? 1 : 0) + tc / chunk;
    if (nproc > 1 && ntc >= nproc) {
      KMP_COUNT_BLOCK(OMP_LOOP_STATIC_STEAL);
      T id = tid;
      T small_chunk, extras;

      small_chunk = ntc / nproc;
      extras = ntc % nproc;

      init = id * small_chunk + (id < extras ? id : extras);
      pr->u.p.count = init;
      pr->u.p.ub = init + small_chunk + (id < extras ? 1 : 0);

      pr->u.p.parm2 = lb;
      // parm3 is the number of times to attempt stealing which is
      // proportional to the number of chunks per thread up until
      // the maximum value of nproc.
      pr->u.p.parm3 = KMP_MIN(small_chunk + extras, nproc);
      pr->u.p.parm4 = (id + 1) % nproc; // remember neighbour tid
      pr->u.p.st = st;
      if (traits_t<T>::type_size > 4) {
        // AC: TODO: check if 16-byte CAS available and use it to
        // improve performance (probably wait for explicit request
        // before spending time on this).
        // For now use dynamically allocated per-thread lock,
        // free memory in __kmp_dispatch_next when status==0.
        KMP_DEBUG_ASSERT(th->th.th_dispatch->th_steal_lock == NULL);
        th->th.th_dispatch->th_steal_lock =
            (kmp_lock_t *)__kmp_allocate(sizeof(kmp_lock_t));
        __kmp_init_lock(th->th.th_dispatch->th_steal_lock);
      }
      break;
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d falling-through to "
                     "kmp_sch_static_balanced\n",
                     gtid));
      schedule = kmp_sch_static_balanced;
      /* too few iterations: fall-through to kmp_sch_static_balanced */
    } // if
    /* FALL-THROUGH to static balanced */
    KMP_FALLTHROUGH();
  } // case
#endif
  case kmp_sch_static_balanced: {
    T init, limit;

    KD_TRACE(
        100,
        ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_balanced case\n",
         gtid));

    if (nproc > 1) {
      T id = tid;

      if (tc < nproc) {
        if (id < tc) {
          init = id;
          limit = id;
          pr->u.p.parm1 = (id == tc - 1); /* parm1 stores *plastiter */
        } else {
          pr->u.p.count = 1; /* means no more chunks to execute */
          pr->u.p.parm1 = FALSE;
          break;
        }
      } else {
        T small_chunk = tc / nproc;
        T extras = tc % nproc;
        init = id * small_chunk + (id < extras ? id : extras);
        limit = init + small_chunk - (id < extras ? 0 : 1);
        pr->u.p.parm1 = (id == nproc - 1);
      }
    } else {
      if (tc > 0) {
        init = 0;
        limit = tc - 1;
        pr->u.p.parm1 = TRUE;
      } else {
        // zero trip count
        pr->u.p.count = 1; /* means no more chunks to execute */
        pr->u.p.parm1 = FALSE;
        break;
      }
    }
#if USE_ITT_BUILD
    // Calculate chunk for metadata report
    if (itt_need_metadata_reporting)
      if (cur_chunk)
        *cur_chunk = limit - init + 1;
#endif
    if (st == 1) {
      pr->u.p.lb = lb + init;
      pr->u.p.ub = lb + limit;
    } else {
      // calculated upper bound, "ub" is user-defined upper bound
      T ub_tmp = lb + limit * st;
      pr->u.p.lb = lb + init * st;
      // adjust upper bound to "ub" if needed, so that MS lastprivate will match
      // it exactly
      if (st > 0) {
        pr->u.p.ub = (ub_tmp + st > ub ? ub : ub_tmp);
      } else {
        pr->u.p.ub = (ub_tmp + st < ub ? ub : ub_tmp);
      }
    }
    if (pr->flags.ordered) {
      pr->u.p.ordered_lower = init;
      pr->u.p.ordered_upper = limit;
    }
    break;
  } // case
#if OMP_45_ENABLED
  case kmp_sch_static_balanced_chunked: {
    // similar to balanced, but chunk adjusted to multiple of simd width
    T nth = nproc;
    KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d runtime(simd:static)"
                   " -> falling-through to static_greedy\n",
                   gtid));
    schedule = kmp_sch_static_greedy;
    if (nth > 1)
      pr->u.p.parm1 = ((tc + nth - 1) / nth + chunk - 1) & ~(chunk - 1);
    else
      pr->u.p.parm1 = tc;
    break;
  } // case
  case kmp_sch_guided_simd:
#endif // OMP_45_ENABLED
  case kmp_sch_guided_iterative_chunked: {
    KD_TRACE(
        100,
        ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_guided_iterative_chunked"
         " case\n",
         gtid));

    if (nproc > 1) {
      if ((2L * chunk + 1) * nproc >= tc) {
        /* chunk size too large, switch to dynamic */
        schedule = kmp_sch_dynamic_chunked;
      } else {
        // when remaining iters become less than parm2 - switch to dynamic
        pr->u.p.parm2 = guided_int_param * nproc * (chunk + 1);
        *(double *)&pr->u.p.parm3 =
            guided_flt_param / nproc; // may occupy parm3 and parm4
      }
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d falling-through to "
                     "kmp_sch_static_greedy\n",
                     gtid));
      schedule = kmp_sch_static_greedy;
      /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
      KD_TRACE(
          100,
          ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_greedy case\n",
           gtid));
      pr->u.p.parm1 = tc;
    } // if
  } // case
  break;
  case kmp_sch_guided_analytical_chunked: {
    KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d "
                   "kmp_sch_guided_analytical_chunked case\n",
                   gtid));

    if (nproc > 1) {
      if ((2L * chunk + 1) * nproc >= tc) {
        /* chunk size too large, switch to dynamic */
        schedule = kmp_sch_dynamic_chunked;
      } else {
        /* commonly used term: (2 nproc - 1)/(2 nproc) */
        DBL x;

#if KMP_USE_X87CONTROL
        /* Linux* OS already has 64-bit computation by default for long double,
           and on Windows* OS on Intel(R) 64, /Qlong_double doesn't work. On
           Windows* OS on IA-32 architecture, we need to set precision to 64-bit
           instead of the default 53-bit. Even though long double doesn't work
           on Windows* OS on Intel(R) 64, the resulting lack of precision is not
           expected to impact the correctness of the algorithm, but this has not
           been mathematically proven. */
        // save original FPCW and set precision to 64-bit, as
        // Windows* OS on IA-32 architecture defaults to 53-bit
        unsigned int oldFpcw = _control87(0, 0);
        _control87(_PC_64, _MCW_PC); // 0,0x30000
#endif
        /* value used for comparison in solver for cross-over point */
        long double target = ((long double)chunk * 2 + 1) * nproc / tc;

        /* crossover point--chunk indexes equal to or greater than
           this point switch to dynamic-style scheduling */
        UT cross;

        /* commonly used term: (2 nproc - 1)/(2 nproc) */
        x = (long double)1.0 - (long double)0.5 / nproc;

#ifdef KMP_DEBUG
        { // test natural alignment
          struct _test_a {
            char a;
            union {
              char b;
              DBL d;
            };
          } t;
          ptrdiff_t natural_alignment =
              (ptrdiff_t)&t.b - (ptrdiff_t)&t - (ptrdiff_t)1;
          //__kmp_warn( " %llx %llx %lld", (long long)&t.d, (long long)&t, (long
          // long)natural_alignment );
          KMP_DEBUG_ASSERT(
              (((ptrdiff_t)&pr->u.p.parm3) & (natural_alignment)) == 0);
        }
#endif // KMP_DEBUG

        /* save the term in thread private dispatch structure */
        *(DBL *)&pr->u.p.parm3 = x;

        /* solve for the crossover point to the nearest integer i for which C_i
           <= chunk */
        {
          UT left, right, mid;
          long double p;

          /* estimate initial upper and lower bound */

          /* doesn't matter what value right is as long as it is positive, but
             it affects performance of the solver */
          right = 229;
          p = __kmp_pow<UT>(x, right);
          if (p > target) {
            do {
              p *= p;
              right <<= 1;
            } while (p > target && right < (1 << 27));
            /* lower bound is previous (failed) estimate of upper bound */
            left = right >> 1;
          } else {
            left = 0;
          }

          /* bisection root-finding method */
          while (left + 1 < right) {
            mid = (left + right) / 2;
            if (__kmp_pow<UT>(x, mid) > target) {
              left = mid;
            } else {
              right = mid;
            }
          } // while
          cross = right;
        }
        /* assert sanity of computed crossover point */
        KMP_ASSERT(cross && __kmp_pow<UT>(x, cross - 1) > target &&
                   __kmp_pow<UT>(x, cross) <= target);

        /* save the crossover point in thread private dispatch structure */
        pr->u.p.parm2 = cross;

// C75803
#if ((KMP_OS_LINUX || KMP_OS_WINDOWS) && KMP_ARCH_X86) && (!defined(KMP_I8))
#define GUIDED_ANALYTICAL_WORKAROUND (*(DBL *)&pr->u.p.parm3)
#else
#define GUIDED_ANALYTICAL_WORKAROUND (x)
#endif
        /* dynamic-style scheduling offset */
        pr->u.p.count = tc - __kmp_dispatch_guided_remaining(
                                 tc, GUIDED_ANALYTICAL_WORKAROUND, cross) -
                        cross * chunk;
#if KMP_USE_X87CONTROL
        // restore FPCW
        _control87(oldFpcw, _MCW_PC);
#endif
      } // if
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d falling-through to "
                     "kmp_sch_static_greedy\n",
                     gtid));
      schedule = kmp_sch_static_greedy;
      /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
      pr->u.p.parm1 = tc;
    } // if
  } // case
  break;
  case kmp_sch_static_greedy:
    KD_TRACE(
        100,
        ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_greedy case\n",
         gtid));
    pr->u.p.parm1 = (nproc > 1) ? (tc + nproc - 1) / nproc : tc;
    break;
  case kmp_sch_static_chunked:
  case kmp_sch_dynamic_chunked:
    if (pr->u.p.parm1 <= 0) {
      pr->u.p.parm1 = KMP_DEFAULT_CHUNK;
    }
    KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d "
                   "kmp_sch_static_chunked/kmp_sch_dynamic_chunked cases\n",
                   gtid));
    break;
  case kmp_sch_trapezoidal: {
    /* TSS: trapezoid self-scheduling, minimum chunk_size = parm1 */

    T parm1, parm2, parm3, parm4;
    KD_TRACE(100,
             ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_trapezoidal case\n",
              gtid));

    parm1 = chunk;

    /* F : size of the first cycle */
    parm2 = (tc / (2 * nproc));

    if (parm2 < 1) {
      parm2 = 1;
    }

    /* L : size of the last cycle.  Make sure the last cycle is not larger
       than the first cycle. */
    if (parm1 < 1) {
      parm1 = 1;
    } else if (parm1 > parm2) {
      parm1 = parm2;
    }

    /* N : number of cycles */
    parm3 = (parm2 + parm1);
    parm3 = (2 * tc + parm3 - 1) / parm3;

    if (parm3 < 2) {
      parm3 = 2;
    }

    /* sigma : decreasing incr of the trapezoid */
    parm4 = (parm3 - 1);
    parm4 = (parm2 - parm1) / parm4;

    // pointless check, because parm4 >= 0 always
    // if ( parm4 < 0 ) {
    //    parm4 = 0;
    //}

    pr->u.p.parm1 = parm1;
    pr->u.p.parm2 = parm2;
    pr->u.p.parm3 = parm3;
    pr->u.p.parm4 = parm4;
  } // case
  break;

  default: {
    __kmp_fatal(KMP_MSG(UnknownSchedTypeDetected), // Primary message
                KMP_HNT(GetNewerLibrary), // Hint
                __kmp_msg_null // Variadic argument list terminator
                );
  } break;
  } // switch
  pr->schedule = schedule;
}